

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O2

int pcap_datalink_name_to_val(char *name)

{
  dlt_choice *pdVar1;
  int iVar2;
  dlt_choice *pdVar3;
  
  pdVar1 = dlt_choices;
  do {
    pdVar3 = pdVar1;
    if (pdVar3->name == (char *)0x0) {
      return -1;
    }
    iVar2 = pcap_strcasecmp(pdVar3->name + 4,name);
    pdVar1 = pdVar3 + 1;
  } while (iVar2 != 0);
  return pdVar3->dlt;
}

Assistant:

int
pcap_datalink_name_to_val(const char *name)
{
	int i;

	for (i = 0; dlt_choices[i].name != NULL; i++) {
		if (pcap_strcasecmp(dlt_choices[i].name + sizeof("DLT_") - 1,
		    name) == 0)
			return (dlt_choices[i].dlt);
	}
	return (-1);
}